

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_signal.hpp
# Opt level: O2

int __thiscall
Signal<std::shared_ptr<Transcript>_>::Connect
          (Signal<std::shared_ptr<Transcript>_> *this,
          function<void_(std::shared_ptr<Transcript>)> *slot)

{
  pair<int,_std::function<void_(std::shared_ptr<Transcript>)>_> local_40;
  
  this->current_id_ = this->current_id_ + 1;
  std::pair<int,_std::function<void_(std::shared_ptr<Transcript>)>_>::pair<int_&,_true>
            (&local_40,&this->current_id_,slot);
  std::
  _Rb_tree<int,std::pair<int_const,std::function<void(std::shared_ptr<Transcript>)>>,std::_Select1st<std::pair<int_const,std::function<void(std::shared_ptr<Transcript>)>>>,std::less<int>,std::allocator<std::pair<int_const,std::function<void(std::shared_ptr<Transcript>)>>>>
  ::_M_emplace_unique<std::pair<int,std::function<void(std::shared_ptr<Transcript>)>>>
            ((_Rb_tree<int,std::pair<int_const,std::function<void(std::shared_ptr<Transcript>)>>,std::_Select1st<std::pair<int_const,std::function<void(std::shared_ptr<Transcript>)>>>,std::less<int>,std::allocator<std::pair<int_const,std::function<void(std::shared_ptr<Transcript>)>>>>
              *)this,&local_40);
  std::_Function_base::~_Function_base(&local_40.second.super__Function_base);
  return this->current_id_;
}

Assistant:

int Connect(std::function<void(Args...)> const &slot) const {
    slots_.insert(std::make_pair(++current_id_, slot));
    return current_id_;
  }